

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O0

void __thiscall CGV::visit(CGV *this,Write *node)

{
  CodeWriter *pCVar1;
  bool bVar2;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *this_00;
  string *__rhs;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  reference local_68;
  ASTNode **child;
  iterator __end1;
  iterator __begin1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *__range1;
  Write *node_local;
  CGV *this_local;
  
  this_00 = AST::ASTNode::getChildren(&node->super_ASTNode);
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::begin
            ((iterator *)&__end1._M_node,this_00);
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::end((iterator *)&child,this_00);
  while( true ) {
    bVar2 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&child);
    if (!bVar2) break;
    local_68 = std::_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**>::operator*
                         ((_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**> *)
                          &__end1._M_node);
    (**(*local_68)->_vptr_ASTNode)(*local_68,this);
    pCVar1 = this->writer;
    __rhs = Variable::getName_abi_cxx11_(this->currentVar);
    std::operator+(&local_88,"Writing variable ",__rhs);
    CodeWriter::comment(pCVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    pCVar1 = this->writer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,"r1",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"r12",&local_e1);
    CodeWriter::loadWord(pCVar1,&local_b8,-4,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    pCVar1 = this->writer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"jl",&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"r15",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"putint",&local_159);
    CodeWriter::OP(pCVar1,&local_108,&local_130,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    pCVar1 = this->writer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"Printing new line",&local_181);
    CodeWriter::comment(pCVar1,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    CodeWriter::endl(this->writer);
    std::_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**>::operator++
              ((_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**> *)&__end1._M_node)
    ;
  }
  return;
}

Assistant:

void CGV::visit(Write *node) {
    for (auto &child : node->getChildren()) {
        child->accept(*this);
        writer->comment("Writing variable " + currentVar->getName());
        writer->loadWord("r1", -4, "r12");
        writer->OP("jl", "r15", "putint");
        writer->comment("Printing new line");
        writer->endl();
    }
}